

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_server.cpp
# Opt level: O0

string * __thiscall
my_lsp_server::lscpp_handle_did_open_abi_cxx11_
          (string *__return_storage_ptr__,my_lsp_server *this,server *param_1,
          DidOpenTextDocumentParams *param_2)

{
  allocator<char> local_41;
  string local_40;
  server *local_20;
  DidOpenTextDocumentParams *param_1_local;
  server *param_0_local;
  
  local_20 = param_1;
  param_1_local = (DidOpenTextDocumentParams *)this;
  param_0_local = (server *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"opened",&local_41);
  lscpp::experimental::make_notification_message(__return_storage_ptr__,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return __return_storage_ptr__;
}

Assistant:

auto
  lscpp_handle_did_open(server &, lscpp::protocol::DidOpenTextDocumentParams) {
    return lscpp::experimental::make_notification_message("opened");
  }